

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O2

RealType __thiscall OpenMD::SC::getAlpha(SC *this,AtomType *atomType1,AtomType *atomType2)

{
  bool bVar1;
  RealType RVar2;
  RealType RVar3;
  double dVar4;
  string DistanceMix;
  SuttonChenAdapter sca2;
  SuttonChenAdapter sca1;
  locale local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  SuttonChenAdapter local_20;
  SuttonChenAdapter local_18;
  
  local_20.at_ = atomType2;
  local_18.at_ = atomType1;
  RVar2 = SuttonChenAdapter::getAlpha(&local_18);
  RVar3 = SuttonChenAdapter::getAlpha(&local_20);
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)&(this->forceField_->forceFieldOptions_).DistanceMixingRule.data_);
  std::locale::locale(local_48);
  toUpper<std::__cxx11::string>(&local_40,local_48);
  std::locale::~locale(local_48);
  bVar1 = std::operator==(&local_40,"GEOMETRIC");
  if (bVar1) {
    dVar4 = RVar2 * RVar3;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  else {
    dVar4 = (RVar2 + RVar3) * 0.5;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return dVar4;
}

Assistant:

RealType SC::getAlpha(AtomType* atomType1, AtomType* atomType2) {
    SuttonChenAdapter sca1 = SuttonChenAdapter(atomType1);
    SuttonChenAdapter sca2 = SuttonChenAdapter(atomType2);
    RealType alpha1        = sca1.getAlpha();
    RealType alpha2        = sca2.getAlpha();

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    std::string DistanceMix  = fopts.getDistanceMixingRule();
    toUpper(DistanceMix);

    if (DistanceMix == "GEOMETRIC")
      return sqrt(alpha1 * alpha2);
    else
      return 0.5 * (alpha1 + alpha2);
  }